

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  Particle<(pica::Dimension)2> particle;
  bool bVar1;
  AssertionResult gtest_ar;
  int i;
  int numParticles;
  ParticleArray particles;
  AssertHelper *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  Type type;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffe90;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffea0;
  Message *in_stack_fffffffffffffeb8;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult local_130 [2];
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffef0;
  AssertHelper *pAStack_108;
  int *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_ffffffffffffff28;
  int iVar2;
  int iVar3;
  undefined8 in_stack_ffffffffffffff38;
  
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ParticleArraySoA
            (in_stack_fffffffffffffe90);
  iVar3 = 0xc;
  for (iVar2 = 0; type = (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20), iVar2 < iVar3;
      iVar2 = iVar2 + 1) {
    in_stack_fffffffffffffe68 = in_stack_ffffffffffffff00;
    in_stack_fffffffffffffe70 = in_stack_ffffffffffffff08;
    in_stack_fffffffffffffe78 = in_stack_ffffffffffffff10;
    in_stack_fffffffffffffe80 = in_stack_ffffffffffffff18;
    in_stack_fffffffffffffe88 = in_stack_ffffffffffffff20;
    in_stack_fffffffffffffe90 = in_stack_ffffffffffffff28;
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (in_stack_fffffffffffffea0);
    particle.position.y = (double)in_stack_fffffffffffffe70;
    particle.position.x = (double)in_stack_fffffffffffffe68;
    particle.p.x = (double)in_stack_fffffffffffffe78;
    particle.p.y = (double)in_stack_fffffffffffffe80;
    particle.p.z = (double)in_stack_fffffffffffffe88;
    particle.factor = (FactorType)in_stack_fffffffffffffe90;
    particle.invGamma._0_4_ = iVar2;
    particle.invGamma._4_4_ = iVar3;
    particle._56_8_ = in_stack_ffffffffffffff38;
    in_stack_fffffffffffffe60 = pAStack_108;
    in_stack_ffffffffffffff00 = in_stack_fffffffffffffe68;
    in_stack_ffffffffffffff08 = in_stack_fffffffffffffe70;
    in_stack_ffffffffffffff10 = in_stack_fffffffffffffe78;
    in_stack_ffffffffffffff18 = in_stack_fffffffffffffe80;
    in_stack_ffffffffffffff20 = in_stack_fffffffffffffe88;
    in_stack_ffffffffffffff28 = in_stack_fffffffffffffe90;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>(in_stack_fffffffffffffef0,particle);
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::size
            ((ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *)0x216b83);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (int *)in_stack_fffffffffffffe60);
  iVar2 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    testing::AssertionResult::failure_message((AssertionResult *)0x216bd9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe90,type,(char *)in_stack_fffffffffffffe80,
               iVar2,in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x216c27);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x216c99);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA
            (in_stack_fffffffffffffe80);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}